

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# orphan-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase628::run(TestCase628 *this)

{
  StructDataBitCount *this_00;
  Builder builder_00;
  Builder builder_01;
  Builder builder_02;
  Builder builder_03;
  Builder builder_04;
  Builder builder_05;
  Reader reader;
  Reader reader_00;
  Builder builder_06;
  Reader reader_01;
  Reader reader_02;
  Builder builder_07;
  Orphan<capnproto_test::capnp::test::TestAllTypes> *pOVar1;
  Builder *value;
  Builder *value_00;
  Orphanage OVar2;
  undefined8 in_stack_fffffffffffffaa0;
  undefined8 in_stack_fffffffffffffaa8;
  undefined8 in_stack_fffffffffffffab0;
  Reader local_500;
  Reader local_4d0;
  BuilderFor<capnproto_test::capnp::test::TestAllTypes> local_4a0;
  undefined1 local_478 [8];
  Orphan<capnproto_test::capnp::test::TestAllTypes> orphan_3;
  BuilderFor<DynamicTypeFor<FromBuilder<Builder>_>_> local_430;
  undefined1 local_3f8 [8];
  Orphanage orphanage_3;
  Reader local_3b8;
  BuilderFor<capnproto_test::capnp::test::TestAllTypes> local_388;
  undefined1 local_360 [8];
  Orphan<capnproto_test::capnp::test::TestAllTypes> orphan_2;
  undefined8 uStack_338;
  undefined8 local_330;
  undefined8 uStack_328;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined1 local_310 [8];
  Orphanage orphanage_2;
  Reader local_2d0;
  BuilderFor<capnproto_test::capnp::test::TestAllTypes> local_2a0;
  undefined1 local_278 [8];
  Orphan<capnproto_test::capnp::test::TestAllTypes> orphan_1;
  undefined8 uStack_250;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 local_238;
  undefined1 local_230 [8];
  Orphanage orphanage_1;
  Reader local_1f0;
  BuilderFor<capnproto_test::capnp::test::TestAllTypes> local_1c0;
  undefined1 local_198 [8];
  Orphan<capnproto_test::capnp::test::TestAllTypes> orphan;
  undefined1 local_148 [8];
  Orphanage orphanage;
  undefined1 auStack_128 [8];
  Builder root;
  MallocMessageBuilder builder;
  TestCase628 *this_local;
  
  this_00 = &root._builder.dataSize;
  MallocMessageBuilder::MallocMessageBuilder
            ((MallocMessageBuilder *)this_00,0x400,GROW_HEURISTICALLY);
  MessageBuilder::initRoot<capnproto_test::capnp::test::TestAllTypes>
            ((Builder *)auStack_128,(MessageBuilder *)this_00);
  orphan.builder.location = (word *)auStack_128;
  builder_00._builder.capTable = root._builder.capTable;
  builder_00._builder.segment = root._builder.segment;
  builder_00._builder.data = root._builder.data;
  builder_00._builder.pointers = root._builder.pointers;
  builder_00._builder.dataSize = (int)in_stack_fffffffffffffaa0;
  builder_00._builder.pointerCount = (short)((ulong)in_stack_fffffffffffffaa0 >> 0x20);
  builder_00._builder._38_2_ = (short)((ulong)in_stack_fffffffffffffaa0 >> 0x30);
  OVar2 = Orphanage::getForMessageContaining<capnproto_test::capnp::test::TestAllTypes::Builder>
                    (builder_00);
  orphanage.arena = (BuilderArena *)OVar2.capTable;
  local_148 = (undefined1  [8])OVar2.arena;
  Orphanage::newOrphan<capnproto_test::capnp::test::TestAllTypes>
            ((Orphan<capnproto_test::capnp::test::TestAllTypes> *)local_198,(Orphanage *)local_148);
  Orphan<capnproto_test::capnp::test::TestAllTypes>::get
            (&local_1c0,(Orphan<capnproto_test::capnp::test::TestAllTypes> *)local_198);
  builder_01._builder.capTable = (CapTableBuilder *)local_1c0._builder.data;
  builder_01._builder.segment = (SegmentBuilder *)local_1c0._builder.capTable;
  builder_01._builder.data = local_1c0._builder.pointers;
  builder_01._builder.pointers = (WirePointer *)local_1c0._builder._32_8_;
  builder_01._builder.dataSize = (int)in_stack_fffffffffffffaa0;
  builder_01._builder.pointerCount = (short)((ulong)in_stack_fffffffffffffaa0 >> 0x20);
  builder_01._builder._38_2_ = (short)((ulong)in_stack_fffffffffffffaa0 >> 0x30);
  initTestMessage(builder_01);
  pOVar1 = kj::mv<capnp::Orphan<capnproto_test::capnp::test::TestAllTypes>>
                     ((Orphan<capnproto_test::capnp::test::TestAllTypes> *)local_198);
  capnproto_test::capnp::test::TestAllTypes::Builder::adoptStructField
            ((Builder *)auStack_128,pOVar1);
  capnproto_test::capnp::test::TestAllTypes::Builder::asReader
            ((Reader *)&orphanage_1.capTable,(Builder *)auStack_128);
  capnproto_test::capnp::test::TestAllTypes::Reader::getStructField
            (&local_1f0,(Reader *)&orphanage_1.capTable);
  reader._reader.capTable = (CapTableReader *)local_1f0._reader.data;
  reader._reader.segment = (SegmentReader *)local_1f0._reader.capTable;
  reader._reader.data = local_1f0._reader.pointers;
  reader._reader.pointers = (WirePointer *)local_1f0._reader._32_8_;
  reader._reader.dataSize = local_1f0._reader.nestingLimit;
  reader._reader.pointerCount = local_1f0._reader._44_2_;
  reader._reader._38_2_ = local_1f0._reader._46_2_;
  reader._reader._40_8_ = in_stack_fffffffffffffaa8;
  checkTestMessage(reader);
  Orphan<capnproto_test::capnp::test::TestAllTypes>::~Orphan
            ((Orphan<capnproto_test::capnp::test::TestAllTypes> *)local_198);
  capnproto_test::capnp::test::TestAllTypes::Builder::initBoolList
            ((Builder *)&orphan_1.builder.location,(Builder *)auStack_128,3);
  builder_02.builder.capTable = (CapTableBuilder *)local_248;
  builder_02.builder.segment = (SegmentBuilder *)uStack_250;
  builder_02.builder.ptr = (byte *)uStack_240;
  builder_02.builder._24_8_ = local_238;
  builder_02.builder.structDataSize = local_1f0._reader.nestingLimit;
  builder_02.builder.structPointerCount = local_1f0._reader._44_2_;
  builder_02.builder.elementSize = local_1f0._reader._46_1_;
  builder_02.builder._39_1_ = local_1f0._reader._47_1_;
  OVar2 = Orphanage::getForMessageContaining<capnp::List<bool,(capnp::Kind)0>::Builder>(builder_02);
  orphanage_1.arena = (BuilderArena *)OVar2.capTable;
  local_230 = (undefined1  [8])OVar2.arena;
  Orphanage::newOrphan<capnproto_test::capnp::test::TestAllTypes>
            ((Orphan<capnproto_test::capnp::test::TestAllTypes> *)local_278,(Orphanage *)local_230);
  Orphan<capnproto_test::capnp::test::TestAllTypes>::get
            (&local_2a0,(Orphan<capnproto_test::capnp::test::TestAllTypes> *)local_278);
  builder_03._builder.capTable = (CapTableBuilder *)local_2a0._builder.data;
  builder_03._builder.segment = (SegmentBuilder *)local_2a0._builder.capTable;
  builder_03._builder.data = local_2a0._builder.pointers;
  builder_03._builder.pointers = (WirePointer *)local_2a0._builder._32_8_;
  builder_03._builder.dataSize = local_1f0._reader.nestingLimit;
  builder_03._builder.pointerCount = local_1f0._reader._44_2_;
  builder_03._builder._38_2_ = local_1f0._reader._46_2_;
  initTestMessage(builder_03);
  pOVar1 = kj::mv<capnp::Orphan<capnproto_test::capnp::test::TestAllTypes>>
                     ((Orphan<capnproto_test::capnp::test::TestAllTypes> *)local_278);
  capnproto_test::capnp::test::TestAllTypes::Builder::adoptStructField
            ((Builder *)auStack_128,pOVar1);
  capnproto_test::capnp::test::TestAllTypes::Builder::asReader
            ((Reader *)&orphanage_2.capTable,(Builder *)auStack_128);
  capnproto_test::capnp::test::TestAllTypes::Reader::getStructField
            (&local_2d0,(Reader *)&orphanage_2.capTable);
  reader_00._reader.capTable = (CapTableReader *)local_2d0._reader.data;
  reader_00._reader.segment = (SegmentReader *)local_2d0._reader.capTable;
  reader_00._reader.data = local_2d0._reader.pointers;
  reader_00._reader.pointers = (WirePointer *)local_2d0._reader._32_8_;
  reader_00._reader.dataSize = local_2d0._reader.nestingLimit;
  reader_00._reader.pointerCount = local_2d0._reader._44_2_;
  reader_00._reader._38_2_ = local_2d0._reader._46_2_;
  reader_00._reader._40_8_ = in_stack_fffffffffffffaa8;
  checkTestMessage(reader_00);
  Orphan<capnproto_test::capnp::test::TestAllTypes>::~Orphan
            ((Orphan<capnproto_test::capnp::test::TestAllTypes> *)local_278);
  toDynamic<capnproto_test::capnp::test::TestAllTypes::Builder&>
            ((BuilderFor<DynamicTypeFor<FromBuilder<Builder_&>_>_> *)&orphan_2.builder.location,
             (capnp *)auStack_128,value);
  builder_06.builder.segment = (SegmentBuilder *)local_330;
  builder_06.schema.super_Schema.raw = (Schema)(Schema)uStack_338;
  builder_06.builder.capTable = (CapTableBuilder *)uStack_328;
  builder_06.builder.data = (void *)local_320;
  builder_06.builder.pointers = (WirePointer *)uStack_318;
  builder_06.builder.dataSize = (int)in_stack_fffffffffffffaa8;
  builder_06.builder.pointerCount = (short)((ulong)in_stack_fffffffffffffaa8 >> 0x20);
  builder_06.builder._38_2_ = (short)((ulong)in_stack_fffffffffffffaa8 >> 0x30);
  OVar2 = Orphanage::getForMessageContaining<capnp::DynamicStruct::Builder>(builder_06);
  orphanage_2.arena = (BuilderArena *)OVar2.capTable;
  local_310 = (undefined1  [8])OVar2.arena;
  Orphanage::newOrphan<capnproto_test::capnp::test::TestAllTypes>
            ((Orphan<capnproto_test::capnp::test::TestAllTypes> *)local_360,(Orphanage *)local_310);
  Orphan<capnproto_test::capnp::test::TestAllTypes>::get
            (&local_388,(Orphan<capnproto_test::capnp::test::TestAllTypes> *)local_360);
  builder_04._builder.capTable = (CapTableBuilder *)local_388._builder.data;
  builder_04._builder.segment = (SegmentBuilder *)local_388._builder.capTable;
  builder_04._builder.data = local_388._builder.pointers;
  builder_04._builder.pointers = (WirePointer *)local_388._builder._32_8_;
  builder_04._builder.dataSize = (int)uStack_318;
  builder_04._builder.pointerCount = (short)((ulong)uStack_318 >> 0x20);
  builder_04._builder._38_2_ = (short)((ulong)uStack_318 >> 0x30);
  initTestMessage(builder_04);
  pOVar1 = kj::mv<capnp::Orphan<capnproto_test::capnp::test::TestAllTypes>>
                     ((Orphan<capnproto_test::capnp::test::TestAllTypes> *)local_360);
  capnproto_test::capnp::test::TestAllTypes::Builder::adoptStructField
            ((Builder *)auStack_128,pOVar1);
  capnproto_test::capnp::test::TestAllTypes::Builder::asReader
            ((Reader *)&orphanage_3.capTable,(Builder *)auStack_128);
  capnproto_test::capnp::test::TestAllTypes::Reader::getStructField
            (&local_3b8,(Reader *)&orphanage_3.capTable);
  reader_01._reader.capTable = (CapTableReader *)local_3b8._reader.data;
  reader_01._reader.segment = (SegmentReader *)local_3b8._reader.capTable;
  reader_01._reader.data = local_3b8._reader.pointers;
  reader_01._reader.pointers = (WirePointer *)local_3b8._reader._32_8_;
  reader_01._reader.dataSize = local_3b8._reader.nestingLimit;
  reader_01._reader.pointerCount = local_3b8._reader._44_2_;
  reader_01._reader._38_2_ = local_3b8._reader._46_2_;
  reader_01._reader._40_8_ = in_stack_fffffffffffffaa8;
  checkTestMessage(reader_01);
  Orphan<capnproto_test::capnp::test::TestAllTypes>::~Orphan
            ((Orphan<capnproto_test::capnp::test::TestAllTypes> *)local_360);
  capnproto_test::capnp::test::TestAllTypes::Builder::initBoolList
            ((Builder *)&orphan_3.builder.location,(Builder *)auStack_128,3);
  toDynamic<capnp::List<bool,(capnp::Kind)0>::Builder>
            (&local_430,(capnp *)&orphan_3.builder.location,value_00);
  builder_07.schema.elementType.field_4 =
       (anon_union_8_2_eba6ea51_for_Type_5)local_430.builder.segment;
  builder_07.schema.elementType._0_8_ = local_430.schema.elementType.field_4.schema;
  builder_07.builder.segment = (SegmentBuilder *)local_430.builder.capTable;
  builder_07.builder.capTable = (CapTableBuilder *)local_430.builder.ptr;
  builder_07.builder.ptr = (byte *)local_430.builder._24_8_;
  builder_07.builder._24_8_ = local_430.builder._32_8_;
  builder_07.builder.structDataSize = (int)in_stack_fffffffffffffab0;
  builder_07.builder.structPointerCount = (short)((ulong)in_stack_fffffffffffffab0 >> 0x20);
  builder_07.builder.elementSize = (char)((ulong)in_stack_fffffffffffffab0 >> 0x30);
  builder_07.builder._39_1_ = (char)((ulong)in_stack_fffffffffffffab0 >> 0x38);
  OVar2 = Orphanage::getForMessageContaining<capnp::DynamicList::Builder>(builder_07);
  orphanage_3.arena = (BuilderArena *)OVar2.capTable;
  local_3f8 = (undefined1  [8])OVar2.arena;
  Orphanage::newOrphan<capnproto_test::capnp::test::TestAllTypes>
            ((Orphan<capnproto_test::capnp::test::TestAllTypes> *)local_478,(Orphanage *)local_3f8);
  Orphan<capnproto_test::capnp::test::TestAllTypes>::get
            (&local_4a0,(Orphan<capnproto_test::capnp::test::TestAllTypes> *)local_478);
  builder_05._builder.capTable = (CapTableBuilder *)local_4a0._builder.data;
  builder_05._builder.segment = (SegmentBuilder *)local_4a0._builder.capTable;
  builder_05._builder.data = local_4a0._builder.pointers;
  builder_05._builder.pointers = (WirePointer *)local_4a0._builder._32_8_;
  builder_05._builder._32_8_ = local_430.builder._24_8_;
  initTestMessage(builder_05);
  pOVar1 = kj::mv<capnp::Orphan<capnproto_test::capnp::test::TestAllTypes>>
                     ((Orphan<capnproto_test::capnp::test::TestAllTypes> *)local_478);
  capnproto_test::capnp::test::TestAllTypes::Builder::adoptStructField
            ((Builder *)auStack_128,pOVar1);
  capnproto_test::capnp::test::TestAllTypes::Builder::asReader(&local_500,(Builder *)auStack_128);
  capnproto_test::capnp::test::TestAllTypes::Reader::getStructField(&local_4d0,&local_500);
  reader_02._reader.capTable = (CapTableReader *)local_4d0._reader.data;
  reader_02._reader.segment = (SegmentReader *)local_4d0._reader.capTable;
  reader_02._reader.data = local_4d0._reader.pointers;
  reader_02._reader.pointers = (WirePointer *)local_4d0._reader._32_8_;
  reader_02._reader.dataSize = local_4d0._reader.nestingLimit;
  reader_02._reader.pointerCount = local_4d0._reader._44_2_;
  reader_02._reader._38_2_ = local_4d0._reader._46_2_;
  reader_02._reader.nestingLimit = local_430.builder.structDataSize;
  reader_02._reader._44_2_ = local_430.builder.structPointerCount;
  reader_02._reader._46_1_ = local_430.builder.elementSize;
  reader_02._reader._47_1_ = local_430.builder._39_1_;
  checkTestMessage(reader_02);
  Orphan<capnproto_test::capnp::test::TestAllTypes>::~Orphan
            ((Orphan<capnproto_test::capnp::test::TestAllTypes> *)local_478);
  MallocMessageBuilder::~MallocMessageBuilder((MallocMessageBuilder *)&root._builder.dataSize);
  return;
}

Assistant:

TEST(Orphans, OrphanageFromBuilder) {
  MallocMessageBuilder builder;
  auto root = builder.initRoot<TestAllTypes>();

  {
    Orphanage orphanage = Orphanage::getForMessageContaining(root);
    Orphan<TestAllTypes> orphan = orphanage.newOrphan<TestAllTypes>();
    initTestMessage(orphan.get());
    root.adoptStructField(kj::mv(orphan));
    checkTestMessage(root.asReader().getStructField());
  }

  {
    Orphanage orphanage = Orphanage::getForMessageContaining(root.initBoolList(3));
    Orphan<TestAllTypes> orphan = orphanage.newOrphan<TestAllTypes>();
    initTestMessage(orphan.get());
    root.adoptStructField(kj::mv(orphan));
    checkTestMessage(root.asReader().getStructField());
  }

#if !CAPNP_LITE
  {
    Orphanage orphanage = Orphanage::getForMessageContaining(toDynamic(root));
    Orphan<TestAllTypes> orphan = orphanage.newOrphan<TestAllTypes>();
    initTestMessage(orphan.get());
    root.adoptStructField(kj::mv(orphan));
    checkTestMessage(root.asReader().getStructField());
  }

  {
    Orphanage orphanage = Orphanage::getForMessageContaining(toDynamic(root.initBoolList(3)));
    Orphan<TestAllTypes> orphan = orphanage.newOrphan<TestAllTypes>();
    initTestMessage(orphan.get());
    root.adoptStructField(kj::mv(orphan));
    checkTestMessage(root.asReader().getStructField());
  }
#endif  // !CAPNP_LITE
}